

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compressHC_continue_generic
              (LZ4_streamHC_t *LZ4_streamHCPtr,char *src,char *dst,int *srcSizePtr,int dstCapacity,
              limitedOutput_directive limit)

{
  int iVar1;
  LZ4_byte *pLVar2;
  BYTE *dictEnd;
  BYTE *dictBegin;
  BYTE *sourceEnd;
  size_t dictSize;
  LZ4HC_CCtx_internal *ctxPtr;
  limitedOutput_directive limit_local;
  int dstCapacity_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  LZ4_streamHC_t *LZ4_streamHCPtr_local;
  
  if (LZ4_streamHCPtr->table[0x8001] == (void *)0x0) {
    LZ4HC_init_internal(&LZ4_streamHCPtr->internal_donotuse,(BYTE *)src);
  }
  if (0x80000000 <
      (ulong)((long)(LZ4_streamHCPtr->internal_donotuse).end - (long)LZ4_streamHCPtr->table[0x8001])
     ) {
    sourceEnd = (LZ4_streamHCPtr->internal_donotuse).end +
                (-(ulong)(LZ4_streamHCPtr->internal_donotuse).dictLimit -
                (long)LZ4_streamHCPtr->table[0x8001]);
    if ((LZ4_byte *)0x10000 < sourceEnd) {
      sourceEnd = (BYTE *)0x10000;
    }
    LZ4_loadDictHC(LZ4_streamHCPtr,
                   (char *)((LZ4_streamHCPtr->internal_donotuse).end + -(long)sourceEnd),
                   (int)sourceEnd);
  }
  if (src != (char *)LZ4_streamHCPtr->table[0x8000]) {
    LZ4HC_setExternalDict(&LZ4_streamHCPtr->internal_donotuse,(BYTE *)src);
  }
  dictBegin = (BYTE *)(src + *srcSizePtr);
  pLVar2 = (LZ4_streamHCPtr->internal_donotuse).dictBase +
           (LZ4_streamHCPtr->internal_donotuse).dictLimit;
  if (((LZ4_streamHCPtr->internal_donotuse).dictBase + (LZ4_streamHCPtr->internal_donotuse).lowLimit
       < dictBegin) && (src < pLVar2)) {
    if (pLVar2 < dictBegin) {
      dictBegin = pLVar2;
    }
    (LZ4_streamHCPtr->internal_donotuse).lowLimit =
         (int)dictBegin - (int)LZ4_streamHCPtr->table[0x8002];
    if ((LZ4_streamHCPtr->internal_donotuse).dictLimit -
        (LZ4_streamHCPtr->internal_donotuse).lowLimit < 4) {
      (LZ4_streamHCPtr->internal_donotuse).lowLimit = (LZ4_streamHCPtr->internal_donotuse).dictLimit
      ;
    }
  }
  iVar1 = LZ4HC_compress_generic
                    (&LZ4_streamHCPtr->internal_donotuse,src,dst,srcSizePtr,dstCapacity,
                     (int)(LZ4_streamHCPtr->internal_donotuse).compressionLevel,limit);
  return iVar1;
}

Assistant:

static int
LZ4_compressHC_continue_generic (LZ4_streamHC_t* LZ4_streamHCPtr,
                                 const char* src, char* dst,
                                 int* srcSizePtr, int dstCapacity,
                                 limitedOutput_directive limit)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(5, "LZ4_compressHC_continue_generic(ctx=%p, src=%p, srcSize=%d, limit=%d)",
                LZ4_streamHCPtr, src, *srcSizePtr, limit);
    assert(ctxPtr != NULL);
    /* auto-init if forgotten */
    if (ctxPtr->base == NULL) LZ4HC_init_internal (ctxPtr, (const BYTE*) src);

    /* Check overflow */
    if ((size_t)(ctxPtr->end - ctxPtr->base) > 2 GB) {
        size_t dictSize = (size_t)(ctxPtr->end - ctxPtr->base) - ctxPtr->dictLimit;
        if (dictSize > 64 KB) dictSize = 64 KB;
        LZ4_loadDictHC(LZ4_streamHCPtr, (const char*)(ctxPtr->end) - dictSize, (int)dictSize);
    }

    /* Check if blocks follow each other */
    if ((const BYTE*)src != ctxPtr->end)
        LZ4HC_setExternalDict(ctxPtr, (const BYTE*)src);

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) src + *srcSizePtr;
        const BYTE* const dictBegin = ctxPtr->dictBase + ctxPtr->lowLimit;
        const BYTE* const dictEnd   = ctxPtr->dictBase + ctxPtr->dictLimit;
        if ((sourceEnd > dictBegin) && ((const BYTE*)src < dictEnd)) {
            if (sourceEnd > dictEnd) sourceEnd = dictEnd;
            ctxPtr->lowLimit = (U32)(sourceEnd - ctxPtr->dictBase);
            if (ctxPtr->dictLimit - ctxPtr->lowLimit < 4) ctxPtr->lowLimit = ctxPtr->dictLimit;
    }   }

    return LZ4HC_compress_generic (ctxPtr, src, dst, srcSizePtr, dstCapacity, ctxPtr->compressionLevel, limit);
}